

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
          *base,tuple<testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
                *generators,bool is_end)

{
  _func_int **in_RSI;
  ParamIteratorInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  *in_RDI;
  tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  *in_stack_ffffffffffffff78;
  tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  *in_stack_ffffffffffffff80;
  ParamGenerator<std::tuple<int,_int>_> *in_stack_ffffffffffffff88;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this_00;
  
  ParamIteratorInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  ::ParamIteratorInterface(in_RDI);
  in_RDI->_vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01fc6f30;
  in_RDI[1]._vptr_ParamIteratorInterface = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamGenerator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
              *)0xd873d2);
  ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
  ::begin((ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
           *)in_stack_ffffffffffffff88);
  std::
  get<1ul,testing::internal::ParamGenerator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamGenerator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
              *)0xd873eb);
  ParamGenerator<std::tuple<int,_int>_>::begin(in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  ::
  tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
              *)in_stack_ffffffffffffff78,(ParamIterator<std::tuple<int,_int>_> *)0xd8740e);
  ParamIterator<std::tuple<int,_int>_>::~ParamIterator
            ((ParamIterator<std::tuple<int,_int>_> *)0xd8741a);
  ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
  ::~ParamIterator((ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
                    *)0xd87424);
  std::
  get<0ul,testing::internal::ParamGenerator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamGenerator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
              *)0xd8743c);
  ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
  ::end((ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
         *)in_stack_ffffffffffffff88);
  std::
  get<1ul,testing::internal::ParamGenerator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamGenerator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
              *)0xd87455);
  ParamGenerator<std::tuple<int,_int>_>::end(in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  ::
  tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
              *)in_stack_ffffffffffffff78,(ParamIterator<std::tuple<int,_int>_> *)0xd87478);
  ParamIterator<std::tuple<int,_int>_>::~ParamIterator
            ((ParamIterator<std::tuple<int,_int>_> *)0xd87484);
  ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
  ::~ParamIterator((ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
                    *)0xd8748e);
  this_00 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)(in_RDI + 6);
  std::
  tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  ::tuple(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  shared_ptr<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  ::shared_ptr((shared_ptr<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
                *)0xd874e5);
  ComputeCurrentValue(this_00);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }